

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void showToolTip(QHelpEvent *helpEvent,QWidget *widget,QStyleOptionComplex *opt,
                ComplexControl complexControl,SubControl subControl)

{
  QRect QVar1;
  QRect QVar2;
  undefined8 uVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  bool bVar7;
  int iVar8;
  QStyle *pQVar9;
  long lVar10;
  uint uVar11;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  qsizetype local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = QWidget::style(widget);
  iVar8 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x70,opt,widget,0);
  QVar2.x2.m_i = local_78._8_4_;
  QVar2.y2.m_i = local_78._12_4_;
  QVar2.x1.m_i = local_78._0_4_;
  QVar2.y1.m_i = local_78._4_4_;
  QVar1.x2.m_i = local_78._8_4_;
  QVar1.y2.m_i = local_78._12_4_;
  QVar1.x1.m_i = local_78._0_4_;
  QVar1.y1.m_i = local_78._4_4_;
  if (iVar8 != 0) goto LAB_004513a6;
  if (complexControl == CC_MdiControls) {
    uVar11 = subControl - SC_ComboBoxFrame;
    subControl = SC_None;
    if (uVar11 < 4) {
      subControl = *(SubControl *)(&DAT_006e9950 + (ulong)uVar11 * 4);
    }
  }
  QVar1 = QVar2;
  if (subControl == SC_None) goto LAB_004513a6;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  if (0xf < (int)subControl) {
    if ((int)subControl < 0x40) {
      if (subControl == SC_ScrollBarFirst) {
        bVar7 = QWidget::isMaximized(widget);
        if ((bVar7) ||
           (lVar10 = QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject), lVar10 == 0)) {
          iVar8 = 0x6ea0e3;
        }
        else {
          iVar8 = 0x6e9f8b;
        }
      }
      else {
        if (subControl != SC_ScrollBarLast) goto switchD_00451425_caseD_3;
        iVar8 = 0x6ea0dd;
      }
    }
    else if (subControl == SC_ScrollBarSlider) {
      iVar8 = 0x6ea0d5;
    }
    else {
      if (subControl != SC_ScrollBarGroove) goto switchD_00451425_caseD_3;
      iVar8 = 0x6f88e1;
    }
    goto LAB_00451505;
  }
  switch(subControl) {
  case SC_ComboBoxFrame:
    iVar8 = 0x66fc19;
    break;
  case SC_ComboBoxEditField:
    iVar8 = 0x6ea0c3;
    break;
  default:
    goto switchD_00451425_caseD_3;
  case SC_ComboBoxArrow:
    iVar8 = 0x6ea0cc;
    break;
  case SC_ComboBoxListBoxPopup:
    iVar8 = 0x6ea008;
  }
LAB_00451505:
  QMetaObject::tr(local_78,(char *)&QMdiSubWindow::staticMetaObject,iVar8);
  pcVar6 = local_58.d.ptr;
  pDVar5 = local_58.d.d;
  qVar4 = local_68;
  uVar3 = local_78._0_8_;
  local_78._0_8_ = local_58.d.d;
  local_58.d.d = (Data *)uVar3;
  local_58.d.ptr = (char16_t *)local_78._8_8_;
  local_78._8_8_ = pcVar6;
  local_68 = local_58.d.size;
  local_58.d.size = qVar4;
  if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
    }
  }
switchD_00451425_caseD_3:
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = QWidget::style(widget);
  local_78 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,complexControl,opt,subControl,widget);
  QToolTip::showText((QPoint *)(helpEvent + 0x18),&local_58,widget,(QRect *)local_78,-1);
  QVar1 = (QRect)local_78;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      QVar1 = (QRect)local_78;
    }
  }
LAB_004513a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  local_78 = (undefined1  [16])QVar1;
  __stack_chk_fail();
}

Assistant:

static void showToolTip(QHelpEvent *helpEvent, QWidget *widget, const QStyleOptionComplex &opt,
                        QStyle::ComplexControl complexControl, QStyle::SubControl subControl)
{
    Q_ASSERT(helpEvent);
    Q_ASSERT(helpEvent->type() == QEvent::ToolTip);
    Q_ASSERT(widget);

    if (widget->style()->styleHint(QStyle::SH_TitleBar_ShowToolTipsOnButtons, &opt, widget))
        return;

    // Convert CC_MdiControls to CC_TitleBar. Sub controls of different complex
    // controls cannot be in the same switch as they might have the same value.
    if (complexControl == QStyle::CC_MdiControls) {
        if (subControl == QStyle::SC_MdiMinButton)
            subControl = QStyle::SC_TitleBarMinButton;
        else if (subControl == QStyle::SC_MdiCloseButton)
            subControl = QStyle::SC_TitleBarCloseButton;
        else if (subControl == QStyle::SC_MdiNormalButton)
            subControl = QStyle::SC_TitleBarNormalButton;
        else
            subControl = QStyle::SC_None;
    }

    // Don't change the tooltip for the base widget itself.
    if (subControl == QStyle::SC_None)
        return;

    QString toolTip;

    switch (subControl) {
    case QStyle::SC_TitleBarMinButton:
        toolTip = QMdiSubWindow::tr("Minimize");
        break;
    case QStyle::SC_TitleBarMaxButton:
        toolTip = QMdiSubWindow::tr("Maximize");
        break;
    case QStyle::SC_TitleBarUnshadeButton:
        toolTip = QMdiSubWindow::tr("Unshade");
        break;
    case QStyle::SC_TitleBarShadeButton:
        toolTip = QMdiSubWindow::tr("Shade");
        break;
    case QStyle::SC_TitleBarNormalButton:
        if (widget->isMaximized() || !qobject_cast<QMdiSubWindow *>(widget))
            toolTip = QMdiSubWindow::tr("Restore Down");
        else
            toolTip = QMdiSubWindow::tr("Restore");
        break;
    case QStyle::SC_TitleBarCloseButton:
        toolTip = QMdiSubWindow::tr("Close");
        break;
    case QStyle::SC_TitleBarContextHelpButton:
        toolTip = QMdiSubWindow::tr("Help");
        break;
    case QStyle::SC_TitleBarSysMenu:
        toolTip = QMdiSubWindow::tr("Menu");
        break;
    default:
        break;
    }

    const QRect rect = widget->style()->subControlRect(complexControl, &opt, subControl, widget);
    QToolTip::showText(helpEvent->globalPos(), toolTip, widget, rect);
}